

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_fan(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_fan *peVar1;
  char *local_30;
  char *fan_type_s;
  envy_bios_power_fan *fan;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).fan;
  local_30 = "UNKNOWN";
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).fan.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse FAN table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).fan.version);
    }
    else {
      fprintf((FILE *)out,"FAN table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).fan.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).fan.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      if ((bios->power).fan.type == '\0') {
        local_30 = "TOGGLE";
      }
      else if ((bios->power).fan.type == '\x01') {
        local_30 = "PWM";
      }
      fprintf((FILE *)out,"-- type: %s, duty_range: [%u:%u]%%, fan_div: %u --\n",local_30,
              (ulong)(bios->power).fan.duty_min,(ulong)(bios->power).fan.duty_max,
              (ulong)(bios->power).fan.divisor);
      fprintf((FILE *)out,"-- unk0e: %u, unk10: %u, unboost delay: %u ms, boosted_duty: %u%% --\n",
              (ulong)(bios->power).fan.unk0e,(ulong)(bios->power).fan.unk10,
              (ulong)(bios->power).fan.unboost_unboost_ms,(ulong)(bios->power).fan.duty_boosted);
      envy_bios_dump_hex(bios,out,peVar1->offset + (uint)(bios->power).fan.hlen,
                         (uint)(bios->power).fan.rlen,mask);
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_fan(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	const char *fan_type_s = "UNKNOWN";

	if (!fan->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan->valid) {
		fprintf(out, "Failed to parse FAN table at 0x%x, version %x\n", fan->offset, fan->version);
		return;
	}

	fprintf(out, "FAN table at 0x%x, version %x\n", fan->offset, fan->version);
	envy_bios_dump_hex(bios, out, fan->offset, fan->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	if (fan->type == 0)
		fan_type_s = "TOGGLE";
	else if (fan->type == 1)
		fan_type_s = "PWM";

	fprintf(out, "-- type: %s, duty_range: [%u:%u]%%, fan_div: %u --\n",
		fan_type_s, fan->duty_min, fan->duty_max, fan->divisor);
	fprintf(out, "-- unk0e: %u, unk10: %u, unboost delay: %u ms, boosted_duty: %u%% --\n",
		fan->unk0e, fan->unk10, fan->unboost_unboost_ms, fan->duty_boosted);

	/* fan boost threshold is set to 96°C but seems to be hardcoded */

	envy_bios_dump_hex(bios, out, fan->offset + fan->hlen, fan->rlen, mask);
	fprintf(out, "\n");
}